

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void add_csc_range_penalty<PredictionData<float,unsigned_long>>
               (WorkerForPredictCSC *workspace,PredictionData<float,_unsigned_long> *prediction_data
               ,double *weights_arr,size_t col_num,double range_low,double range_high)

{
  pointer puVar1;
  ulong *puVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  float *pfVar5;
  pointer pdVar6;
  unsigned_long uVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  pointer puVar11;
  ulong *puVar12;
  pointer puVar13;
  ulong uVar14;
  size_t row;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  unsigned_long uVar19;
  ulong *puVar20;
  ulong uVar21;
  double dVar22;
  
  puVar13 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar15 = workspace->st;
  puVar1 = puVar13 + sVar15;
  uVar9 = workspace->end;
  puVar11 = puVar13 + uVar9 + 1;
  if (puVar1 != puVar11) {
    uVar9 = (long)puVar11 - (long)puVar1 >> 3;
    lVar8 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar11,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar11);
    puVar13 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar15 = workspace->st;
    uVar9 = workspace->end;
  }
  puVar3 = prediction_data->Xc_ind;
  uVar19 = prediction_data->Xc_indptr[col_num];
  uVar4 = prediction_data->Xc_indptr[col_num + 1];
  puVar10 = puVar13 + sVar15;
  puVar12 = puVar13 + uVar9 + 1;
  uVar14 = (long)puVar12 - (long)puVar10 >> 3;
  if (0 < (long)uVar14) {
    do {
      uVar17 = uVar14 >> 1;
      uVar21 = ~uVar17 + uVar14;
      uVar14 = uVar17;
      if (puVar10[uVar17] < puVar3[uVar19]) {
        puVar10 = puVar10 + uVar17 + 1;
        uVar14 = uVar21;
      }
    } while (0 < (long)uVar14);
  }
  uVar14 = puVar3[uVar4 - 1];
  if ((0.0 < range_low) || (range_high < 0.0)) {
    if (weights_arr == (double *)0x0) {
      if (sVar15 <= uVar9) {
        pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pdVar6[puVar13[sVar15]] = pdVar6[puVar13[sVar15]] + -1.0;
          sVar15 = sVar15 + 1;
        } while (sVar15 <= uVar9);
      }
    }
    else if (sVar15 <= uVar9) {
      pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar7 = puVar13[sVar15];
        pdVar6[uVar7] = pdVar6[uVar7] - weights_arr[uVar7];
        sVar15 = sVar15 + 1;
      } while (sVar15 <= uVar9);
    }
    if (uVar19 != uVar4 && puVar10 != puVar12) {
      pfVar5 = prediction_data->Xc;
      pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (uVar17 = *puVar10, uVar17 <= uVar14) {
        puVar2 = puVar3 + uVar19;
        uVar21 = *puVar2;
        if (uVar21 == uVar17) {
          if ((NAN(pfVar5[uVar19])) ||
             ((dVar22 = (double)pfVar5[uVar19], range_low <= dVar22 && (dVar22 <= range_high)))) {
            dVar22 = 1.0;
            if (weights_arr != (double *)0x0) {
              dVar22 = weights_arr[uVar17];
            }
            pdVar6[uVar17] = dVar22 + pdVar6[uVar17];
          }
          if (puVar10 == puVar13 + uVar9) {
            return;
          }
          if (uVar19 == uVar4 - 1) {
            return;
          }
          puVar20 = puVar2 + 1;
          puVar10 = puVar10 + 1;
          uVar17 = (long)((long)puVar3 + (uVar4 * 8 - (long)puVar20)) >> 3;
          if (0 < (long)uVar17) {
            do {
              uVar16 = uVar17 >> 1;
              uVar21 = ~uVar16 + uVar17;
              uVar17 = uVar16;
              if (puVar20[uVar16] < *puVar10) {
                puVar20 = puVar20 + uVar16 + 1;
                uVar17 = uVar21;
              }
            } while (0 < (long)uVar17);
          }
LAB_00311cf0:
          uVar19 = (long)puVar20 - (long)puVar3 >> 3;
        }
        else {
          if (uVar21 <= uVar17) {
            puVar20 = puVar2 + 1;
            uVar21 = (long)((long)puVar3 + (uVar4 * 8 - (long)(puVar2 + 1))) >> 3;
            while (0 < (long)uVar21) {
              uVar18 = uVar21 >> 1;
              uVar16 = ~uVar18 + uVar21;
              uVar21 = uVar18;
              if (puVar20[uVar18] < uVar17) {
                puVar20 = puVar20 + uVar18 + 1;
                uVar21 = uVar16;
              }
            }
            goto LAB_00311cf0;
          }
          puVar10 = puVar10 + 1;
          uVar17 = (long)puVar12 - (long)puVar10 >> 3;
          while (0 < (long)uVar17) {
            uVar16 = uVar17 >> 1;
            uVar18 = ~uVar16 + uVar17;
            uVar17 = uVar16;
            if (puVar10[uVar16] < uVar21) {
              puVar10 = puVar10 + uVar16 + 1;
              uVar17 = uVar18;
            }
          }
        }
        if (puVar10 == puVar12) {
          return;
        }
        if (uVar19 == uVar4) {
          return;
        }
      }
    }
  }
  else if (uVar19 != uVar4 && puVar10 != puVar12) {
    pfVar5 = prediction_data->Xc;
    pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (uVar17 = *puVar10, uVar17 <= uVar14) {
      puVar2 = puVar3 + uVar19;
      uVar21 = *puVar2;
      if (uVar21 == uVar17) {
        if ((!NAN(pfVar5[uVar19])) &&
           ((dVar22 = (double)pfVar5[uVar19], dVar22 < range_low || (range_high < dVar22)))) {
          dVar22 = 1.0;
          if (weights_arr != (double *)0x0) {
            dVar22 = weights_arr[uVar17];
          }
          pdVar6[uVar17] = pdVar6[uVar17] - dVar22;
        }
        if (puVar10 == puVar13 + uVar9) {
          return;
        }
        if (uVar19 == uVar4 - 1) {
          return;
        }
        puVar20 = puVar2 + 1;
        puVar10 = puVar10 + 1;
        uVar17 = (long)((long)puVar3 + (uVar4 * 8 - (long)puVar20)) >> 3;
        if (0 < (long)uVar17) {
          do {
            uVar16 = uVar17 >> 1;
            uVar21 = ~uVar16 + uVar17;
            uVar17 = uVar16;
            if (puVar20[uVar16] < *puVar10) {
              puVar20 = puVar20 + uVar16 + 1;
              uVar17 = uVar21;
            }
          } while (0 < (long)uVar17);
        }
LAB_00311b38:
        uVar19 = (long)puVar20 - (long)puVar3 >> 3;
      }
      else {
        if (uVar21 <= uVar17) {
          puVar20 = puVar2 + 1;
          uVar21 = (long)((long)puVar3 + (uVar4 * 8 - (long)(puVar2 + 1))) >> 3;
          while (0 < (long)uVar21) {
            uVar18 = uVar21 >> 1;
            uVar16 = ~uVar18 + uVar21;
            uVar21 = uVar18;
            if (puVar20[uVar18] < uVar17) {
              puVar20 = puVar20 + uVar18 + 1;
              uVar21 = uVar16;
            }
          }
          goto LAB_00311b38;
        }
        puVar10 = puVar10 + 1;
        uVar17 = (long)puVar12 - (long)puVar10 >> 3;
        while (0 < (long)uVar17) {
          uVar16 = uVar17 >> 1;
          uVar18 = ~uVar16 + uVar17;
          uVar17 = uVar16;
          if (puVar10[uVar16] < uVar21) {
            puVar10 = puVar10 + uVar16 + 1;
            uVar17 = uVar18;
          }
        }
      }
      if (puVar10 == puVar12) {
        return;
      }
      if (uVar19 == uVar4) {
        return;
      }
    }
  }
  return;
}

Assistant:

void add_csc_range_penalty(WorkerForPredictCSC     &workspace,
                           const PredictionData    &prediction_data,
                           const double *restrict  weights_arr,
                           size_t                  col_num,
                           double                  range_low,
                           double                  range_high)
{
    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    size_t st_col  = prediction_data.Xc_indptr[col_num];
    size_t end_col = prediction_data.Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = prediction_data.Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(workspace.ix_arr.data() + workspace.st,
                                      workspace.ix_arr.data() + workspace.end + 1,
                                      prediction_data.Xc_ind[st_col]);

    if (range_low <= 0 && range_high >= 0)
    {
        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(!std::isnan(prediction_data.Xc[curr_pos])
                               &&
                           (   prediction_data.Xc[curr_pos] < range_low    ||
                               prediction_data.Xc[curr_pos] > range_high   )))
                {
                    workspace.depths[*row] -= (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }

    else
    {
        if (likely(weights_arr == NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]]--;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] -= weights_arr[workspace.ix_arr[row]];


        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(std::isnan(prediction_data.Xc[curr_pos])
                               ||
                           (   prediction_data.Xc[curr_pos] >= range_low    &&
                               prediction_data.Xc[curr_pos] <= range_high   )))
                {
                    workspace.depths[*row] += (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }
}